

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int getnumlimit(Header *h,char **fmt,int df)

{
  int sz;
  int df_local;
  char **fmt_local;
  Header *h_local;
  
  h_local._4_4_ = getnum(fmt,df);
  if ((0x10 < (int)h_local._4_4_) || ((int)h_local._4_4_ < 1)) {
    h_local._4_4_ =
         luaL_error(h->L,"integral size (%d) out of limits [1,%d]",(ulong)h_local._4_4_,0x10);
  }
  return h_local._4_4_;
}

Assistant:

static int getnumlimit (Header *h, const char **fmt, int df) {
  int sz = getnum(fmt, df);
  if (sz > MAXINTSIZE || sz <= 0)
    return luaL_error(h->L, "integral size (%d) out of limits [1,%d]",
                            sz, MAXINTSIZE);
  return sz;
}